

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_window_quantiles.cc
# Opt level: O3

void __thiscall
prometheus::detail::TimeWindowQuantiles::insert(TimeWindowQuantiles *this,double value)

{
  CKMSQuantiles *pCVar1;
  CKMSQuantiles *bucket;
  CKMSQuantiles *this_00;
  
  rotate(this);
  pCVar1 = (this->ckms_quantiles_).
           super__Vector_base<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->ckms_quantiles_).
                 super__Vector_base<prometheus::detail::CKMSQuantiles,_std::allocator<prometheus::detail::CKMSQuantiles>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pCVar1; this_00 = this_00 + 1
      ) {
    CKMSQuantiles::insert(this_00,value);
  }
  return;
}

Assistant:

void TimeWindowQuantiles::insert(double value) {
  rotate();
  for (auto& bucket : ckms_quantiles_) {
    bucket.insert(value);
  }
}